

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclApplyUpdateToBest(Vec_Int_t *vGatesBest,Vec_Int_t *vGates,Vec_Int_t *vUpdate)

{
  int iVar1;
  int iVar2;
  int GateId2;
  int GateId;
  int ObjId;
  int i;
  Vec_Int_t *vUpdate_local;
  Vec_Int_t *vGates_local;
  Vec_Int_t *vGatesBest_local;
  
  for (GateId = 0; iVar1 = Vec_IntSize(vUpdate), GateId + 1 < iVar1; GateId = GateId + 2) {
    iVar1 = Vec_IntEntry(vUpdate,GateId);
    iVar2 = Vec_IntEntry(vUpdate,GateId + 1);
    Vec_IntWriteEntry(vGatesBest,iVar1,iVar2);
  }
  Vec_IntClear(vUpdate);
  GateId = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vGatesBest);
    if (iVar1 <= GateId) {
      return;
    }
    iVar1 = Vec_IntEntry(vGatesBest,GateId);
    iVar2 = Vec_IntEntry(vGates,GateId);
    if (iVar1 != iVar2) break;
    GateId = GateId + 1;
  }
  __assert_fail("GateId == GateId2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                ,0x2cc,"void Abc_SclApplyUpdateToBest(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Abc_SclApplyUpdateToBest( Vec_Int_t * vGatesBest, Vec_Int_t * vGates, Vec_Int_t * vUpdate )
{
    int i, ObjId, GateId, GateId2; 
    Vec_IntForEachEntryDouble( vUpdate, ObjId, GateId, i )
        Vec_IntWriteEntry( vGatesBest, ObjId, GateId );
    Vec_IntClear( vUpdate );
    Vec_IntForEachEntryTwo( vGatesBest, vGates, GateId, GateId2, i )
        assert( GateId == GateId2 );
//    Vec_IntClear( vGatesBest );
//    Vec_IntAppend( vGatesBest, vGates );
}